

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMoves.cpp
# Opt level: O0

void runTestMoves(vector<int,_std::allocator<int>_> *moves,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *expectedValues,
                 BoardSize boardSize)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  pointer pBVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  ulong uVar5;
  size_type sVar6;
  const_reference lhs;
  const_reference rhs;
  char *message;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values;
  const_iterator cStack_48;
  int move;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  unique_ptr<Board,_std::default_delete<Board>_> local_28;
  __single_object board;
  BoardSize boardSize_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *expectedValues_local;
  vector<int,_std::allocator<int>_> *moves_local;
  
  board._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
  super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.super__Head_base<0UL,_Board_*,_false>
  ._M_head_impl._4_4_ = boardSize;
  std::make_unique<Board,BoardSize&,BoardMode>
            ((BoardSize *)&local_28,
             (BoardMode *)
             ((long)&board._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                     super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                     super__Head_base<0UL,_Board_*,_false>._M_head_impl + 4));
  __end1 = std::vector<int,_std::allocator<int>_>::begin(moves);
  cStack_48 = std::vector<int,_std::allocator<int>_>::end(moves);
  while (bVar2 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                           (&__end1,&stack0xffffffffffffffb8), ((bVar2 ^ 0xffU) & 1) != 0) {
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    iVar1 = *piVar3;
    pBVar4 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&local_28);
    Board::checkMove(pBVar4,(long)(iVar1 / 10),(long)(iVar1 % 10));
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  pBVar4 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&local_28);
  this = Board::getBoardValues(pBVar4);
  for (gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      uVar5 = (ulong)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this), uVar5 < sVar6;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    lhs = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (this,(long)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
    rhs = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    (expectedValues,
                     (long)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_80,"values[i]","expectedValues[i]",lhs,rhs);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar2) {
      testing::Message::Message(&local_88);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Przemyslawmd[P]Fifteen/tests/TestMoves.cpp"
                 ,0x19,message);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::Message::~Message(&local_88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (!bVar2) break;
  }
  std::unique_ptr<Board,_std::default_delete<Board>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

void runTestMoves(const std::vector<int>& moves, const std::vector<uint>& expectedValues, BoardSize boardSize)
{
    auto board = std::make_unique<Board>(boardSize, BoardMode::NUMERIC);
    for (int move : moves)
    {
        board->checkMove(move / 10, move % 10);
    }
    
    const auto& values = board->getBoardValues();
    for (int i = 0; i < values.size(); ++i)
    {
        ASSERT_EQ(values[i], expectedValues[i]);
    }
}